

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::CompExp(SQCompiler *this)

{
  long lVar1;
  SQOpcode op;
  
  ShiftExp(this);
LAB_00112a0b:
  do {
    lVar1 = this->_token;
    if (lVar1 < 0x10b) {
      if (lVar1 != 0x3c) {
        if (lVar1 == 0x3e) {
          op = _OP_CMP;
          goto LAB_00112a88;
        }
        if (lVar1 != 0x10a) {
          return;
        }
      }
    }
    else if (lVar1 != 0x10b) {
      if (lVar1 == 0x118) {
        op = _OP_EXISTS;
      }
      else {
        if (lVar1 != 0x137) {
          return;
        }
        op = _OP_INSTANCEOF;
      }
LAB_00112a88:
      BIN_EXP<void(SQCompiler::*)()>(this,op,0x112aa2,0);
      goto LAB_00112a0b;
    }
    BIN_EXP<void(SQCompiler::*)()>(this,_OP_CMP,0x112aa2,0);
  } while( true );
}

Assistant:

void CompExp()
    {
        ShiftExp();
        for(;;) switch(_token) {
        case _SC('>'): BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_G); break;
        case _SC('<'): BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_L); break;
        case TK_GE: BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_GE); break;
        case TK_LE: BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_LE); break;
        case TK_IN: BIN_EXP(_OP_EXISTS, &SQCompiler::ShiftExp); break;
        case TK_INSTANCEOF: BIN_EXP(_OP_INSTANCEOF, &SQCompiler::ShiftExp); break;
        default: return;
        }
    }